

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromDataReader::load(ModelBinFromDataReader *this,int w,int type)

{
  long *plVar1;
  unsigned_short *puVar2;
  char *pcVar3;
  void *pvVar4;
  uchar *puVar5;
  byte *pbVar6;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  bool bVar7;
  size_t nread_2;
  size_t nread_1;
  void *refbuf_4;
  void *refbuf_3;
  int i;
  float *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  size_t align_weight_data_size;
  float quantization_value [256];
  void *refbuf_2;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  void *refbuf_1;
  size_t align_data_size_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  void *refbuf;
  size_t align_data_size;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  size_t nread;
  Mat m;
  Mat *in_stack_fffffffffffff7e8;
  Mat *in_stack_fffffffffffff7f0;
  Mat *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  size_type in_stack_fffffffffffff808;
  Mat *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff820;
  int iVar8;
  undefined7 in_stack_fffffffffffff828;
  undefined1 in_stack_fffffffffffff82f;
  Mat local_6e0;
  long local_698;
  void *local_690;
  Mat local_688;
  void *local_640;
  int local_634;
  float *local_630;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_628;
  size_t local_610;
  float local_608 [258];
  Mat local_200;
  void *local_1b8 [4];
  Mat local_198;
  void *local_150;
  size_t local_148;
  undefined8 local_98;
  size_t local_90;
  int local_84;
  uint local_80;
  uint local_6c;
  size_t local_68;
  Mat local_60;
  uint local_18;
  int local_14;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffff820 >> 0x20);
  local_18 = in_ECX;
  local_14 = in_EDX;
  ncnn::Mat::Mat(&local_60);
  if (local_18 == 0) {
    local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                         ((long *)**(undefined8 **)(in_RSI + 8),&local_6c,4);
    if (local_68 == 4) {
      local_84 = (local_6c & 0xff) + (local_6c >> 8 & 0xff) + (local_6c >> 0x10 & 0xff) +
                 (local_6c >> 0x18);
      if (local_6c == 0x1306b47) {
        local_90 = ncnn::alignSize((long)local_14 * 2,4);
        local_98 = 0;
        local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                             ((long *)**(undefined8 **)(in_RSI + 8),local_90,&local_98);
        if (local_68 == local_90) {
          ncnn::Mat::from_float16
                    ((unsigned_short *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828)
                     ,iVar8);
          ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
          ncnn::Mat::~Mat((Mat *)0x151ec0);
        }
        else {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x151f00);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffff810,in_stack_fffffffffffff808);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x151f3b);
          local_68 = (**(code **)(*plVar1 + 0x18))(plVar1,puVar2,local_90);
          bVar7 = local_68 == local_90;
          if (bVar7) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x152001);
            ncnn::Mat::from_float16
                      ((unsigned_short *)
                       CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),iVar8);
            ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
            ncnn::Mat::~Mat((Mat *)0x15203e);
          }
          else {
            fprintf(_stderr,"ModelBin read float16_weights failed %zd",local_68);
            fprintf(_stderr,"\n");
            ncnn::Mat::Mat(in_RDI);
          }
          local_80 = (uint)!bVar7;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
          if (local_80 != 0) goto LAB_00152e26;
        }
        ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_80 = 1;
      }
      else if (local_6c == 0xd4b38) {
        local_148 = ncnn::alignSize((long)local_14,4);
        local_150 = (void *)0x0;
        local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                             ((long *)**(undefined8 **)(in_RSI + 8),local_148,&local_150);
        if (local_68 == local_148) {
          ncnn::Mat::Mat(&local_198,local_14,local_150,1,(Allocator *)0x0);
          ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
          ncnn::Mat::~Mat((Mat *)0x1521ac);
        }
        else {
          std::vector<signed_char,_std::allocator<signed_char>_>::vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)0x1521ec);
          std::vector<signed_char,_std::allocator<signed_char>_>::resize
                    ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffff810,
                     in_stack_fffffffffffff808);
          iVar8 = (int)(in_stack_fffffffffffff808 >> 0x20);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                             ((vector<signed_char,_std::allocator<signed_char>_> *)0x152227);
          local_68 = (**(code **)(*plVar1 + 0x18))(plVar1,pcVar3,local_148);
          if (local_68 == local_148) {
            ncnn::Mat::create(in_stack_fffffffffffff810,iVar8,
                              CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                              (Allocator *)in_stack_fffffffffffff7f8);
            bVar7 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
            if (bVar7) {
              ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
              local_80 = 1;
            }
            else {
              pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)0x152377);
              memcpy(local_60.data,pcVar3,(long)local_14);
              local_80 = 0;
            }
          }
          else {
            fprintf(_stderr,"ModelBin read int8_weights failed %zd",local_68);
            fprintf(_stderr,"\n");
            ncnn::Mat::Mat(in_RDI);
            local_80 = 1;
          }
          std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)
                     CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
          if (local_80 != 0) goto LAB_00152e26;
        }
        ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_80 = 1;
      }
      else if (local_6c == 0x2c056) {
        local_1b8[0] = (void *)0x0;
        local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                             ((long *)**(undefined8 **)(in_RSI + 8),(long)local_14 << 2,local_1b8);
        if (local_68 == (long)local_14 * 4) {
          ncnn::Mat::Mat(&local_200,local_14,local_1b8[0],4,(Allocator *)0x0);
          ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
          ncnn::Mat::~Mat((Mat *)0x1524a9);
        }
        else {
          ncnn::Mat::create(in_stack_fffffffffffff810,(int)(in_stack_fffffffffffff808 >> 0x20),
                            CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                            (Allocator *)in_stack_fffffffffffff7f8);
          bVar7 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
          if (bVar7) {
            ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
            local_80 = 1;
            goto LAB_00152e26;
          }
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_60);
          local_68 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar4,(long)local_14 << 2);
          if (local_68 != (long)local_14 * 4) {
            fprintf(_stderr,"ModelBin read weight_data failed %zd",local_68);
            fprintf(_stderr,"\n");
            ncnn::Mat::Mat(in_RDI);
            local_80 = 1;
            goto LAB_00152e26;
          }
        }
        ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_80 = 1;
      }
      else {
        if (local_84 == 0) {
          if ((char)local_6c == '\0') {
            local_640 = (void *)0x0;
            local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                                 ((long *)**(undefined8 **)(in_RSI + 8),(long)local_14 << 2,
                                  &local_640);
            if (local_68 == (long)local_14 * 4) {
              ncnn::Mat::Mat(&local_688,local_14,local_640,4,(Allocator *)0x0);
              ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
              ncnn::Mat::~Mat((Mat *)0x152a0a);
            }
            else {
              ncnn::Mat::create(in_stack_fffffffffffff810,(int)(in_stack_fffffffffffff808 >> 0x20),
                                CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                                (Allocator *)in_stack_fffffffffffff7f8);
              bVar7 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
              if (bVar7) {
                ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
                local_80 = 1;
                goto LAB_00152e26;
              }
              plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
              pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_60);
              local_68 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar4,(long)local_14 << 2);
              if (local_68 != (long)local_14 * 4) {
                fprintf(_stderr,"ModelBin read weight_data failed %zd",local_68);
                fprintf(_stderr,"\n");
                ncnn::Mat::Mat(in_RDI);
                local_80 = 1;
                goto LAB_00152e26;
              }
            }
          }
        }
        else {
          ncnn::Mat::create(in_stack_fffffffffffff810,(int)(in_stack_fffffffffffff808 >> 0x20),
                            CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                            (Allocator *)in_stack_fffffffffffff7f8);
          bVar7 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
          if (bVar7) {
            ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
            local_80 = 1;
            goto LAB_00152e26;
          }
          local_68 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                               ((long *)**(undefined8 **)(in_RSI + 8),local_608,0x400);
          if (local_68 != 0x400) {
            fprintf(_stderr,"ModelBin read quantization_value failed %zd",local_68);
            fprintf(_stderr,"\n");
            ncnn::Mat::Mat(in_RDI);
            local_80 = 1;
            goto LAB_00152e26;
          }
          local_610 = ncnn::alignSize((long)local_14,4);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15279c);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff810,in_stack_fffffffffffff808);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1527d1);
          local_68 = (**(code **)(*plVar1 + 0x18))(plVar1,puVar5,local_610);
          if (local_68 == local_610) {
            local_630 = ncnn::Mat::operator_cast_to_float_(&local_60);
            for (local_634 = 0; local_634 < local_14; local_634 = local_634 + 1) {
              pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&local_628,(long)local_634);
              local_630[local_634] = local_608[*pbVar6];
            }
            local_80 = 0;
          }
          else {
            fprintf(_stderr,"ModelBin read index_array failed %zd",local_68);
            fprintf(_stderr,"\n");
            ncnn::Mat::Mat(in_RDI);
            local_80 = 1;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
          if (local_80 != 0) goto LAB_00152e26;
        }
        ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_80 = 1;
      }
    }
    else {
      fprintf(_stderr,"ModelBin read flag_struct failed %zd",local_68);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
      local_80 = 1;
    }
    goto LAB_00152e26;
  }
  if (local_18 != 1) {
    fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)local_18);
    fprintf(_stderr,"\n");
    ncnn::Mat::Mat(in_RDI);
    local_80 = 1;
    goto LAB_00152e26;
  }
  local_690 = (void *)0x0;
  local_698 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                        ((long *)**(undefined8 **)(in_RSI + 8),(long)local_14 << 2,&local_690);
  if (local_698 == (long)local_14 * 4) {
    ncnn::Mat::Mat(&local_6e0,local_14,local_690,4,(Allocator *)0x0);
    ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    ncnn::Mat::~Mat((Mat *)0x152c53);
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffff810,(int)((ulong)local_698 >> 0x20),
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                      (Allocator *)in_stack_fffffffffffff7f8);
    bVar7 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
    if (bVar7) {
      ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      local_80 = 1;
      goto LAB_00152e26;
    }
    in_stack_fffffffffffff7f0 = (Mat *)**(long **)(in_RSI + 8);
    pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_60);
    in_stack_fffffffffffff7e8 =
         (Mat *)(**(code **)((long)in_stack_fffffffffffff7f0->data + 0x18))
                          (in_stack_fffffffffffff7f0,pvVar4,(long)local_14 << 2);
    if (in_stack_fffffffffffff7e8 != (Mat *)((long)local_14 * 4)) {
      fprintf(_stderr,"ModelBin read weight_data failed %zd",in_stack_fffffffffffff7e8);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
      local_80 = 1;
      goto LAB_00152e26;
    }
  }
  ncnn::Mat::Mat(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  local_80 = 1;
LAB_00152e26:
  ncnn::Mat::~Mat((Mat *)0x152e33);
  return in_RDI;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(float16_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(float16_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(int8_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, int8_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}